

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::RegexPattern::IsDotAll(RegexPattern *this)

{
  bool bVar1;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  Program *pPVar2;
  bool local_11;
  RegexPattern *this_local;
  
  this_00 = GetScriptContext(this);
  this_01 = Js::ScriptContext::GetConfig(this_00);
  bVar1 = Js::ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
  local_11 = false;
  if (bVar1) {
    pPVar2 = Memory::WriteBarrierPtr<UnifiedRegex::Program>::operator->
                       (&(this->rep).unified.program);
    local_11 = (pPVar2->flags & DotAllRegexFlag) != NoRegexFlags;
  }
  return local_11;
}

Assistant:

bool RegexPattern::IsDotAll() const
    {
        return GetScriptContext()->GetConfig()->IsES2018RegExDotAllEnabled() && (rep.unified.program->flags & DotAllRegexFlag) != 0;
    }